

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
GEO::KdTree::get_nearest_neighbors_leaf
          (KdTree *this,index_t node_index,index_t b,index_t e,double *query_point,
          NearestNeighbors *NN)

{
  index_t i_00;
  coord_index_t dim;
  uint *puVar1;
  double *p2;
  double dVar2;
  double sq_dist_1;
  index_t ii_1;
  double sq_dist;
  double *p;
  index_t i;
  index_t ii;
  double local_sq_dist [16];
  index_t local_idx [16];
  index_t *idx;
  double dStack_38;
  index_t nb;
  double R;
  NearestNeighbors *NN_local;
  double *query_point_local;
  index_t e_local;
  index_t b_local;
  index_t node_index_local;
  KdTree *this_local;
  
  e_local = node_index;
  _b_local = this;
  geo_argused<unsigned_int>(&e_local);
  NN->nb_visited = (ulong)(e - b) + NN->nb_visited;
  dStack_38 = NearestNeighbors::furthest_neighbor_sq_dist(NN);
  puVar1 = vector<unsigned_int>::operator[](&this->point_index_,b);
  for (p._4_4_ = 0; p._4_4_ < e - b; p._4_4_ = p._4_4_ + 1) {
    i_00 = puVar1[p._4_4_];
    p2 = NearestNeighborSearch::point_ptr(&this->super_NearestNeighborSearch,i_00);
    dim = NearestNeighborSearch::dimension(&this->super_NearestNeighborSearch);
    dVar2 = Geom::distance2<double>(query_point,p2,dim);
    local_idx[(ulong)p._4_4_ - 2] = i_00;
    *(double *)(&i + (ulong)p._4_4_ * 2) = dVar2;
  }
  for (sq_dist_1._4_4_ = 0; sq_dist_1._4_4_ < e - b; sq_dist_1._4_4_ = sq_dist_1._4_4_ + 1) {
    if (*(double *)(&i + (ulong)sq_dist_1._4_4_ * 2) <= dStack_38) {
      NearestNeighbors::insert
                (NN,local_idx[(ulong)sq_dist_1._4_4_ - 2],
                 *(double *)(&i + (ulong)sq_dist_1._4_4_ * 2));
      dStack_38 = NearestNeighbors::furthest_neighbor_sq_dist(NN);
    }
  }
  return;
}

Assistant:

void KdTree::get_nearest_neighbors_leaf(
	index_t node_index, index_t b, index_t e,
	const double* query_point,
	NearestNeighbors& NN	    
    ) const {
	geo_argused(node_index);
        NN.nb_visited += (e-b);
	double R = NN.furthest_neighbor_sq_dist();
	index_t nb = e-b;
	const index_t* geo_restrict idx = &point_index_[b];

	// TODO: check generated ASM (I'd like to have AVX here).
	// We may need to dispatch according to dimension.
	
	index_t local_idx[MAX_LEAF_SIZE];
	double  local_sq_dist[MAX_LEAF_SIZE];

	// Cache indices and computed distances in local
	// array. I guess AVX likes that (to be checked).
	// Not sure, because access to p is indirect, maybe
	// I should copy the points to local memory before
	// computing the distances (or having another copy
	// of the points array that I pre-reorder so that
	// leaf's points are in a contiguous chunk of memory),
	// to be tested...
	for(index_t ii=0; ii<nb; ++ii) {
	    index_t i = idx[ii];
	    const double* geo_restrict p = point_ptr(i);
	    double sq_dist = Geom::distance2(
		query_point, p, dimension()
	    );
	    local_idx[ii] = i;
	    local_sq_dist[ii] = sq_dist;
	}

	// Now insert the points that are nearer to query
	// point than NN's bounding ball.
	for(index_t ii=0; ii<nb; ++ii) {
	    double sq_dist = local_sq_dist[ii];
	    if(sq_dist <= R) {
		NN.insert(local_idx[ii],sq_dist);
		R = NN.furthest_neighbor_sq_dist();
	    }
	}
    }